

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QTableWidgetItem * __thiscall QTableModel::takeVerticalHeaderItem(QTableModel *this,int section)

{
  QTableWidgetItem *pQVar1;
  QList<QTableWidgetItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  reference ppQVar4;
  int in_ESI;
  long in_RDI;
  QTableWidgetItem *itm;
  qsizetype in_stack_ffffffffffffffc8;
  
  if (-1 < in_ESI) {
    this_00 = (QList<QTableWidgetItem_*> *)(long)in_ESI;
    qVar2 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30));
    if ((long)this_00 < qVar2) {
      ppQVar3 = QList<QTableWidgetItem_*>::at(this_00,in_stack_ffffffffffffffc8);
      pQVar1 = *ppQVar3;
      if (pQVar1 == (QTableWidgetItem *)0x0) {
        return (QTableWidgetItem *)0x0;
      }
      pQVar1->view = (QTableWidget *)0x0;
      pQVar1->d->headerItem = false;
      ppQVar4 = QList<QTableWidgetItem_*>::operator[](this_00,in_stack_ffffffffffffffc8);
      *ppQVar4 = (QTableWidgetItem *)0x0;
      return pQVar1;
    }
  }
  return (QTableWidgetItem *)0x0;
}

Assistant:

QTableWidgetItem *QTableModel::takeVerticalHeaderItem(int section)
{
    if (section < 0 || section >= verticalHeaderItems.size())
        return nullptr;
    QTableWidgetItem *itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->view = nullptr;
        itm->d->headerItem = false;
        verticalHeaderItems[section] = 0;
    }
    return itm;
}